

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O2

void radio_properties(t_gobj *z,_glist *owner)

{
  char *objname;
  t_radio *x;
  int mode;
  
  if (*(int *)((long)&z[0x4a].g_next + 4) == 0) {
    mode = -1;
  }
  else {
    mode = *(int *)&z[0x49].g_next;
  }
  objname = "vradio";
  if (*(int *)&z[0x4a].g_next == 0) {
    objname = "hradio";
  }
  iemgui_new_dialog(z,(t_iemgui *)z,objname,
                    (float)(*(int *)((long)&z[4].g_pd + 4) /
                           *(int *)((long)&z[3].g_pd[1].c_floatmethod + 4)),8.0,0.0,0.0,0.0,0.0,0,
                    mode,"new-only","new&old",1,-1,*(int *)((long)&z[0x49].g_next + 4));
  return;
}

Assistant:

static void radio_properties(t_gobj *z, t_glist *owner)
{
    t_radio *x = (t_radio *)z;
    int hchange = -1;
    const char*objname;

    if(x->x_orientation == horizontal)
    {
        objname = "hradio";
    } else {
        objname = "vradio";
    }
    if(x->x_compat)
        hchange = x->x_change;

    iemgui_new_dialog(x, &x->x_gui, objname,
        x->x_gui.x_w/IEMGUI_ZOOM(x), IEM_GUI_MINSIZE,
        0, 0,
        0, 0,
        0,
        hchange, "new-only", "new&old",
        1, -1, x->x_number);
}